

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_extract(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap;
  ulong uVar1;
  jx9_value *pjVar2;
  extract_aux_data sAux;
  undefined8 local_448;
  int local_440;
  char *local_438;
  int local_430;
  undefined4 local_42c;
  
  if (((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) ||
     (pMap = (jx9_hashmap *)((*apArg)->x).pOther, pMap->nEntry == 0)) {
    pjVar2 = pCtx->pRet;
    jx9MemObjRelease(pjVar2);
    (pjVar2->x).rVal = 0.0;
  }
  else {
    uVar1 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&local_448 + uVar1 + 4) = 0;
      uVar1 = uVar1 + 4;
    } while (uVar1 < 0x1c);
    if (nArg != 1) {
      pjVar2 = apArg[1];
      jx9MemObjToInteger(pjVar2);
      local_42c = *(undefined4 *)&pjVar2->x;
      if (2 < nArg) {
        local_438 = jx9_value_to_string(apArg[2],&local_430);
      }
    }
    local_448 = pCtx->pVm;
    jx9HashmapWalk(pMap,VmExtractCallback,&local_448);
    pjVar2 = pCtx->pRet;
    jx9MemObjRelease(pjVar2);
    pjVar2->x = (anon_union_8_3_18420de5_for_x)(long)local_440;
  }
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int vm_builtin_extract(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	extract_aux_data sAux;
	jx9_hashmap *pMap;
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Empty map, return  0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Prepare the aux data */
	SyZero(&sAux, sizeof(extract_aux_data)-sizeof(sAux.zWorker));
	if( nArg > 1 ){
		sAux.iFlags = jx9_value_to_int(apArg[1]);
		if( nArg > 2 ){
			sAux.zPrefix = jx9_value_to_string(apArg[2], &sAux.Prefixlen);
		}
	}
	sAux.pVm = pCtx->pVm;
	/* Invoke the worker callback */
	jx9HashmapWalk(pMap, VmExtractCallback, &sAux);
	/* Number of variables successfully imported */
	jx9_result_int(pCtx, sAux.iCount);
	return JX9_OK;
}